

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O3

StringPtr kj::consumeLine(char **ptr)

{
  char *pcVar1;
  char *pcVar2;
  char *pcVar3;
  char cVar4;
  char *pcVar5;
  StringPtr SVar6;
  
  pcVar1 = *ptr;
  pcVar2 = pcVar1 + -1;
  for (; (cVar4 = *pcVar1, cVar4 == '\t' || (pcVar3 = pcVar1, cVar4 == ' ')); pcVar1 = pcVar1 + 1) {
    pcVar2 = pcVar2 + 1;
  }
  while( true ) {
    while( true ) {
      while (cVar4 == '\n') {
        pcVar5 = pcVar3 + 1;
        cVar4 = pcVar3[1];
        if ((cVar4 != ' ') && (cVar4 != '\t')) goto LAB_003e9011;
        *pcVar3 = ' ';
        pcVar3 = pcVar5;
      }
      if (cVar4 == '\r') break;
      if (cVar4 == '\0') {
        *ptr = pcVar3;
        goto LAB_003e9017;
      }
      cVar4 = pcVar3[1];
      pcVar3 = pcVar3 + 1;
    }
    if (pcVar3[1] == '\n') {
      pcVar5 = pcVar3 + 2;
    }
    else {
      pcVar5 = pcVar3 + 1;
    }
    cVar4 = pcVar3[(ulong)(pcVar3[1] == '\n') + 1];
    if ((cVar4 != ' ') && (cVar4 != '\t')) break;
    *pcVar3 = ' ';
    pcVar5[-1] = ' ';
    pcVar3 = pcVar5;
  }
LAB_003e9011:
  *ptr = pcVar5;
  *pcVar3 = '\0';
LAB_003e9017:
  SVar6.content.size_ = (long)pcVar3 - (long)pcVar2;
  SVar6.content.ptr = pcVar1;
  return (StringPtr)SVar6.content;
}

Assistant:

static kj::StringPtr consumeLine(char*& ptr) {
  char* start = skipSpace(ptr);
  char* p = start;

  for (;;) {
    switch (*p) {
      case '\0':
        ptr = p;
        return kj::StringPtr(start, p);

      case '\r': {
        char* end = p++;
        if (*p == '\n') ++p;

        if (*p == ' ' || *p == '\t') {
          // Whoa, continuation line. These are deprecated, but historically a line starting with
          // a space was treated as a continuation of the previous line. The behavior should be
          // the same as if the \r\n were replaced with spaces, so let's do that here to prevent
          // confusion later.
          *end = ' ';
          p[-1] = ' ';
          break;
        }

        ptr = p;
        *end = '\0';
        return kj::StringPtr(start, end);
      }

      case '\n': {
        char* end = p++;

        if (*p == ' ' || *p == '\t') {
          // Whoa, continuation line. These are deprecated, but historically a line starting with
          // a space was treated as a continuation of the previous line. The behavior should be
          // the same as if the \n were replaced with spaces, so let's do that here to prevent
          // confusion later.
          *end = ' ';
          break;
        }

        ptr = p;
        *end = '\0';
        return kj::StringPtr(start, end);
      }

      default:
        ++p;
        break;
    }
  }
}